

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tape.cpp
# Opt level: O0

void __thiscall
Storage::Tape::BinaryTapePlayer::BinaryTapePlayer(BinaryTapePlayer *this,int input_clock_rate)

{
  int input_clock_rate_local;
  BinaryTapePlayer *this_local;
  
  TapePlayer::TapePlayer(&this->super_TapePlayer,input_clock_rate);
  (this->super_TapePlayer).super_TimedEventLoop._vptr_TimedEventLoop =
       (_func_int **)&PTR_process_next_event_00caba60;
  (this->super_TapePlayer).super_Source._vptr_Source = (_func_int **)&DAT_00cabaa0;
  this->delegate_ = (Delegate *)0x0;
  this->input_level_ = false;
  this->motor_is_running_ = false;
  this->observer_ = (Observer *)0x0;
  return;
}

Assistant:

BinaryTapePlayer::BinaryTapePlayer(int input_clock_rate) :
	TapePlayer(input_clock_rate)
{}